

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

char * nni_pipe_peer_addr(nni_pipe *p,char *buf)

{
  size_t local_a8;
  size_t sz;
  nng_sockaddr sa;
  char *buf_local;
  nni_pipe *p_local;
  
  local_a8 = 0x88;
  sz._0_2_ = 0;
  sa.s_storage.sa_pad[0xf] = (uint64_t)buf;
  buf_local = (char *)p;
  nni_pipe_getopt(p,"remote-address",&sz,&local_a8,NNI_TYPE_SOCKADDR);
  nng_str_sockaddr((nng_sockaddr *)&sz,(char *)sa.s_storage.sa_pad[0xf],0x90);
  return (char *)sa.s_storage.sa_pad[0xf];
}

Assistant:

char *
nni_pipe_peer_addr(nni_pipe *p, char buf[NNG_MAXADDRSTRLEN])
{
	nng_sockaddr sa;
	size_t       sz = sizeof(sa);
	sa.s_family     = AF_UNSPEC;
	nni_pipe_getopt(p, NNG_OPT_REMADDR, &sa, &sz, NNI_TYPE_SOCKADDR);
	nng_str_sockaddr(&sa, buf, NNG_MAXADDRSTRLEN);
	return (buf);
}